

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,Eigen::Matrix<double,1,3,1,1,3>const&,Eigen::Matrix<double,1,3,1,1,3>const&>
::load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<pybind11::detail::value_and_holder&,Eigen::Matrix<double,1,3,1,1,3>const&,Eigen::Matrix<double,1,3,1,1,3>const&>
           *this,long call)

{
  char *pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  bool bVar5;
  char local_12 [2];
  
  puVar3 = *(undefined8 **)(call + 8);
  uVar2 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x30) = *puVar3;
  type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
            ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)(this + 0x18),
             (PyObject *)puVar3[1],SUB41((uVar2 & 2) >> 1,0));
  type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void>::load
            ((type_caster<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_void> *)this,
             *(PyObject **)(*(long *)(call + 8) + 0x10),SUB41((**(uint **)(call + 0x20) & 4) >> 2,0)
            );
  lVar4 = 0;
  do {
    bVar5 = lVar4 == 2;
    if (bVar5) {
      return bVar5;
    }
    pcVar1 = local_12 + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  return bVar5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }